

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void deserialize_node<_IO_FILE*,short,unsigned_long>
               (SingleTreeIndex *node,_IO_FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian)

{
  size_t vec_size;
  
  if (!interrupt_switch) {
    vec_size = (size_t)&interrupt_switch;
    read_bytes<unsigned_long,unsigned_long>(&vec_size,1,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_long>
              (&node->terminal_node_mappings,vec_size,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_long>(&vec_size,1,in,buffer,diff_endian);
    read_bytes<double,double>(&node->node_distances,vec_size,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_long>(&vec_size,1,in,buffer,diff_endian);
    read_bytes<double,double>(&node->node_depths,vec_size,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_long>(&vec_size,1,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_long>(&node->reference_points,vec_size,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_long>(&vec_size,1,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_long>(&node->reference_indptr,vec_size,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_long>(&vec_size,1,in,buffer,diff_endian);
    read_bytes<unsigned_long,unsigned_long>(&node->reference_mapping,vec_size,in,buffer,diff_endian)
    ;
    read_bytes<unsigned_long,unsigned_long>(&node->n_terminal,1,in,buffer,diff_endian);
  }
  return;
}

Assistant:

void deserialize_node(SingleTreeIndex &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    size_t vec_size;
    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.terminal_node_mappings, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<double, double>(node.node_distances, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<double, double>(node.node_depths, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_points, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_indptr, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_mapping, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&node.n_terminal, (size_t)1, in, buffer, diff_endian);
}